

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accessor_case.cc
# Opt level: O1

string_view google::protobuf::compiler::rust::ViewReceiver(AccessorCase accessor_case)

{
  string_view sVar1;
  
  if (accessor_case < (VIEW|MUT)) {
    sVar1._M_str = &DAT_00475d98 + *(int *)(&DAT_00475d98 + (ulong)accessor_case * 4);
    sVar1._M_len = *(size_t *)((long)&DAT_00475da5 + (ulong)accessor_case * 8 + 3);
    return sVar1;
  }
  return (string_view)(ZEXT816(0x344549) << 0x40);
}

Assistant:

absl::string_view ViewReceiver(AccessorCase accessor_case) {
  switch (accessor_case) {
    case AccessorCase::VIEW:
      return "self";
    case AccessorCase::OWNED:
    case AccessorCase::MUT:
      return "&self";
  }
  return "";
}